

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O1

void __thiscall chrono::ChForce::UpdateState(ChForce *this)

{
  double *__dest;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ChBody *this_00;
  element_type *peVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  undefined1 auVar32 [32];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined8 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  ChVectorN<double,_4> Qfrot;
  double local_b0;
  undefined1 local_a0 [16];
  double dStack_90;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  
  dVar33 = DAT_00b90ac8;
  this_00 = this->Body;
  peVar25 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_b0 = DAT_00b90ac0;
  dVar70 = VNULL;
  if (peVar25 != (element_type *)0x0) {
    dVar70 = (this->super_ChObj).ChTime;
    (*peVar25->_vptr_ChFunction[4])();
  }
  peVar25 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar25 != (element_type *)0x0) {
    local_b0 = (this->super_ChObj).ChTime;
    (*peVar25->_vptr_ChFunction[4])();
  }
  peVar25 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar25 != (element_type *)0x0) {
    dVar33 = (this->super_ChObj).ChTime;
    (*peVar25->_vptr_ChFunction[4])();
  }
  if (this->frame == BODY) {
    dVar1 = (this->restpos).m_data[2];
    dVar2 = (this->restpos).m_data[1];
    (this->vrelpoint).m_data[0] = dVar70 + (this->restpos).m_data[0];
    (this->vrelpoint).m_data[1] = local_b0 + dVar2;
    (this->vrelpoint).m_data[2] = dVar33 + dVar1;
    ChBody::Point_Body2World((ChVector<double> *)local_a0,this_00,&this->vrelpoint);
    if ((ChVector<double> *)local_a0 != &this->vpoint) {
      (this->vpoint).m_data[0] = (double)local_a0._0_8_;
      (this->vpoint).m_data[1] = (double)local_a0._8_8_;
      (this->vpoint).m_data[2] = dStack_90;
    }
  }
  else if (this->frame == WORLD) {
    dVar1 = (this->restpos).m_data[2];
    dVar2 = (this->restpos).m_data[1];
    (this->vpoint).m_data[0] = dVar70 + (this->restpos).m_data[0];
    (this->vpoint).m_data[1] = local_b0 + dVar2;
    (this->vpoint).m_data[2] = dVar33 + dVar1;
    ChBody::Point_World2Body((ChVector<double> *)local_a0,this_00,&this->vpoint);
    if ((ChVector<double> *)local_a0 != &this->vrelpoint) {
      (this->vrelpoint).m_data[0] = (double)local_a0._0_8_;
      (this->vrelpoint).m_data[1] = (double)local_a0._8_8_;
      (this->vrelpoint).m_data[2] = dStack_90;
    }
  }
  dVar70 = (this->super_ChObj).ChTime;
  local_58 = this->mforce;
  (*((this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar2 = DAT_00b90ac8;
  dVar33 = DAT_00b90ac0;
  dVar1 = VNULL;
  peVar25 = (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70 = VNULL;
  local_60 = dVar70;
  if (peVar25 != (element_type *)0x0) {
    local_70 = (this->super_ChObj).ChTime;
    (*peVar25->_vptr_ChFunction[4])();
  }
  peVar25 = (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar70 = dVar33;
  if (peVar25 != (element_type *)0x0) {
    dVar70 = (this->super_ChObj).ChTime;
    (*peVar25->_vptr_ChFunction[4])();
  }
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar2;
  peVar25 = (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar25 != (element_type *)0x0) {
    auVar64._8_8_ = 0;
    auVar64._0_8_ = (this->super_ChObj).ChTime;
    local_68 = dVar70;
    (*peVar25->_vptr_ChFunction[4])();
    dVar70 = local_68;
  }
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar2;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1;
  dVar1 = local_60 * local_58;
  if (this->align == BODY_DIR) {
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (this->vreldir).m_data[2];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = (this->vreldir).m_data[0];
    dVar33 = (this->vreldir).m_data[1];
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         dVar33 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar61 = vfmadd231sd_fma(auVar73,auVar58,auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar26 = vfmadd231sd_fma(auVar61,auVar49,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar78._8_8_ = 0;
    auVar78._0_8_ =
         dVar33 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar61 = vfmadd231sd_fma(auVar78,auVar58,auVar28);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar61 = vfmadd231sd_fma(auVar61,auVar49,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         dVar33 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar71 = vfmadd231sd_fma(auVar65,auVar58,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar27 = vfmadd231sd_fma(auVar71,auVar49,auVar12);
    (this->vdir).m_data[0] = auVar27._0_8_;
    (this->vdir).m_data[1] = auVar61._0_8_;
    (this->vdir).m_data[2] = auVar26._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_70;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar66._8_8_ = 0;
    auVar66._0_8_ =
         dVar70 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar71 = vfmadd231sd_fma(auVar66,auVar79,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar28 = vfmadd231sd_fma(auVar71,auVar64,auVar14);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar1 * auVar27._0_8_ + auVar28._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         dVar70 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar27 = vfmadd231sd_fma(auVar50,auVar79,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar27 = vfmadd231sd_fma(auVar27,auVar64,auVar16);
    dVar33 = dVar1 * auVar61._0_8_ + auVar27._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar51._8_8_ = 0;
    auVar51._0_8_ =
         dVar70 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar61 = vfmadd231sd_fma(auVar51,auVar79,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar64 = vfmadd231sd_fma(auVar61,auVar64,auVar18);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar1 * auVar26._0_8_ + auVar64._0_8_;
  }
  else if (this->align == WORLD_DIR) {
    dVar2 = (this->vdir).m_data[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar2;
    dVar33 = (this->vdir).m_data[0];
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar33;
    dVar3 = (this->vdir).m_data[1];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar72._8_8_ = 0;
    auVar72._0_8_ =
         dVar3 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar61 = vfmadd231sd_fma(auVar72,auVar57,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar61 = vfmadd231sd_fma(auVar61,auVar48,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar77._8_8_ = 0;
    auVar77._0_8_ =
         dVar3 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar71 = vfmadd231sd_fma(auVar77,auVar57,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar71 = vfmadd231sd_fma(auVar71,auVar48,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar81._8_8_ = 0;
    auVar81._0_8_ =
         dVar3 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar26 = vfmadd231sd_fma(auVar81,auVar57,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar26 = vfmadd231sd_fma(auVar26,auVar48,auVar9);
    (this->vreldir).m_data[0] = auVar26._0_8_;
    (this->vreldir).m_data[1] = auVar71._0_8_;
    (this->vreldir).m_data[2] = auVar61._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar1 * dVar33 + local_70;
    dVar33 = dVar70 + dVar1 * dVar3;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auVar64._0_8_ + dVar1 * dVar2;
  }
  (this->force).m_data[0] = auVar71._0_8_;
  (this->force).m_data[1] = dVar33;
  (this->force).m_data[2] = auVar61._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       dVar33 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar64 = vfmadd231sd_fma(auVar34,auVar71,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar64 = vfmadd231sd_fma(auVar64,auVar61,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       dVar33 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar26 = vfmadd231sd_fma(auVar41,auVar71,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar26 = vfmadd231sd_fma(auVar26,auVar61,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       dVar33 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar27 = vfmadd231sd_fma(auVar52,auVar71,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar61 = vfmadd231sd_fma(auVar27,auVar61,auVar24);
  (this->relforce).m_data[0] = auVar61._0_8_;
  (this->relforce).m_data[1] = auVar26._0_8_;
  (this->relforce).m_data[2] = auVar64._0_8_;
  if (this->mode == TORQUE) {
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    dVar70 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[0];
    dVar33 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[1];
    dVar33 = dVar33 + dVar33;
    dVar1 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
            .m_data[2];
    dVar1 = dVar1 + dVar1;
    dVar2 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
            .m_data[3];
    dVar2 = dVar2 + dVar2;
    auVar75._0_8_ = -dVar33;
    auVar75._8_8_ = 0x8000000000000000;
    auVar80._0_8_ = -dVar1;
    auVar80._8_8_ = 0x8000000000000000;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar2;
    auVar64 = vunpcklpd_avx(auVar62,auVar80);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar70 + dVar70;
    auVar61 = vunpcklpd_avx(auVar75,auVar37);
    auVar84._16_16_ = auVar64;
    auVar84._0_16_ = auVar61;
    auVar63._0_8_ = -dVar2;
    auVar63._8_8_ = 0x8000000000000000;
    auVar64 = vunpcklpd_avx(auVar80,auVar63);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar33;
    auVar71 = vunpcklpd_avx(auVar37,auVar44);
    auVar39._16_16_ = auVar71;
    auVar39._0_16_ = auVar64;
    dVar70 = (this->relforce).m_data[1];
    auVar46._8_8_ = dVar70;
    auVar46._0_8_ = dVar70;
    auVar46._16_8_ = dVar70;
    auVar46._24_8_ = dVar70;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar1;
    auVar64 = vunpcklpd_avx(auVar63,auVar55);
    dVar70 = (this->relforce).m_data[0];
    auVar32._8_8_ = dVar70;
    auVar32._0_8_ = dVar70;
    auVar32._16_8_ = dVar70;
    auVar32._24_8_ = dVar70;
    auVar32 = vmulpd_avx512vl(auVar84,auVar32);
    auVar71 = vfmadd231pd_fma(auVar32,auVar46,auVar39);
    dVar70 = (this->relforce).m_data[2];
    auVar40._8_8_ = dVar70;
    auVar40._0_8_ = dVar70;
    auVar40._16_8_ = dVar70;
    auVar40._24_8_ = dVar70;
    auVar47._16_16_ = auVar61;
    auVar47._0_16_ = auVar64;
    auVar64 = vfmadd231pd_fma(ZEXT1632(auVar71),auVar40,auVar47);
  }
  else {
    if (this->mode != FORCE) {
      return;
    }
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [0] = auVar71._0_8_;
    dVar70 = (this->force).m_data[2];
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [1] = (this->force).m_data[1];
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [2] = dVar70;
    dVar70 = (this->vrelpoint).m_data[2];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar70;
    dVar33 = (this->vrelpoint).m_data[0];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar33;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (this->vrelpoint).m_data[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = (this->relforce).m_data[0];
    dVar1 = (this->relforce).m_data[1];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar70 * dVar1;
    auVar64 = vfmadd231sd_fma(auVar74,auVar59,ZEXT816(0) << 0x40);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = (this->relforce).m_data[2];
    auVar28 = vfnmadd231sd_fma(auVar64,auVar53,auVar82);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar1 * 0.0;
    auVar64 = vfnmadd231sd_fma(auVar86,auVar59,auVar35);
    auVar26 = vfmadd231sd_fma(auVar64,auVar42,auVar82);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar1 * dVar33;
    auVar64 = vfmsub231sd_fma(auVar36,auVar53,auVar59);
    auVar27 = vfmadd231sd_fma(auVar64,auVar82,ZEXT816(0) << 0x40);
    dVar70 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[0];
    dVar33 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[1];
    dVar33 = dVar33 + dVar33;
    dVar1 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
            .m_data[2];
    dVar1 = dVar1 + dVar1;
    dVar2 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
            .m_data[3];
    dVar2 = dVar2 + dVar2;
    auVar83._0_8_ = -dVar33;
    auVar83._8_8_ = 0x8000000000000000;
    auVar87._0_8_ = -dVar1;
    auVar87._8_8_ = 0x8000000000000000;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar2;
    auVar64 = vunpcklpd_avx(auVar67,auVar87);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar70 + dVar70;
    auVar61 = vunpcklpd_avx(auVar83,auVar43);
    auVar88._16_16_ = auVar64;
    auVar88._0_16_ = auVar61;
    auVar68._0_8_ = -dVar2;
    auVar68._8_8_ = 0x8000000000000000;
    auVar64 = vunpcklpd_avx(auVar87,auVar68);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar33;
    auVar71 = vunpcklpd_avx(auVar43,auVar54);
    auVar45._16_16_ = auVar71;
    auVar45._0_16_ = auVar64;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar1;
    auVar64 = vunpcklpd_avx(auVar68,auVar60);
    auVar56._16_16_ = auVar61;
    auVar56._0_16_ = auVar64;
    auVar61 = ZEXT816(0);
    auVar32 = vsubpd_avx(ZEXT1632(auVar61),auVar88);
    dVar70 = auVar28._0_8_;
    auVar69._0_8_ = dVar70 * auVar32._0_8_;
    auVar69._8_8_ = dVar70 * auVar32._8_8_;
    auVar69._16_8_ = dVar70 * auVar32._16_8_;
    auVar69._24_8_ = dVar70 * auVar32._24_8_;
    auVar32 = vsubpd_avx(ZEXT1632(auVar61),auVar45);
    uVar85 = auVar26._0_8_;
    auVar76._8_8_ = uVar85;
    auVar76._0_8_ = uVar85;
    auVar76._16_8_ = uVar85;
    auVar76._24_8_ = uVar85;
    auVar64 = vfmadd231pd_fma(auVar69,auVar76,auVar32);
    auVar32 = vsubpd_avx(ZEXT1632(auVar61),auVar56);
    auVar38._0_8_ = auVar27._0_8_;
    auVar38._8_8_ = auVar38._0_8_;
    auVar38._16_8_ = auVar38._0_8_;
    auVar38._24_8_ = auVar38._0_8_;
    auVar64 = vfmadd231pd_fma(ZEXT1632(auVar64),auVar38,auVar32);
  }
  _local_a0 = ZEXT1632(auVar64);
  __dest = (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
           array + 3;
  uVar31 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
  uVar29 = 4;
  if (uVar31 < 4) {
    uVar29 = uVar31;
  }
  if (uVar31 != 0) {
    memcpy(__dest,local_a0,(ulong)(uVar29 * 8));
  }
  if (uVar31 < 4) {
    uVar30 = (ulong)(uVar29 << 3);
    memcpy((void *)((long)(this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
                          m_storage.m_data.array + uVar30 + 0x18),local_a0 + uVar30,0x20 - uVar30);
  }
  return;
}

Assistant:

void ChForce::UpdateState() {
    ChBody* my_body;
    double modforce;
    ChVector<> vectforce;
    ChVector<> vmotion;
    ChVector<> xyzforce;

    my_body = GetBody();

    // ====== Update the position of point of application

    vmotion = VNULL;
    if (move_x)
        vmotion.x() = move_x->Get_y(ChTime);
    if (move_y)
        vmotion.y() = move_y->Get_y(ChTime);
    if (move_z)
        vmotion.z() = move_z->Get_y(ChTime);

    switch (frame) {
        case WORLD:
            vpoint = Vadd(restpos, vmotion);                // Uw
            vrelpoint = my_body->Point_World2Body(vpoint);  // Uo1 = [A]'(Uw-Xo1)
            break;
        case BODY:
            vrelpoint = Vadd(restpos, vmotion);             // Uo1
            vpoint = my_body->Point_Body2World(vrelpoint);  // Uw = Xo1+[A]Uo1
            break;
    }

    // ====== Update the fm force vector and add fv

    modforce = mforce * modula->Get_y(ChTime);

    vectforce = VNULL;
    xyzforce = VNULL;
    if (f_x)
        xyzforce.x() = f_x->Get_y(ChTime);
    if (f_y)
        xyzforce.y() = f_y->Get_y(ChTime);
    if (f_z)
        xyzforce.z() = f_z->Get_y(ChTime);

    switch (align) {
        case WORLD_DIR:
            vreldir = my_body->TransformDirectionParentToLocal(vdir);
            vectforce = Vmul(vdir, modforce);
            vectforce = Vadd(vectforce, xyzforce);
            break;
        case BODY_DIR:
            vdir = my_body->TransformDirectionLocalToParent(vreldir);
            vectforce = Vmul(vdir, modforce);
            xyzforce = my_body->TransformDirectionLocalToParent(xyzforce);
            vectforce = Vadd(vectforce, xyzforce);
            break;
    }

    force = vectforce;                                           // Fw
    relforce = my_body->TransformDirectionParentToLocal(force);  // Fo1 = [A]'Fw

    // ====== Update the Qc lagrangian!

    switch (mode) {
        case FORCE: {
            Qf(0) = force.x();  // pos.lagrangian Qfx
            Qf(1) = force.y();
            Qf(2) = force.z();

            //   Qfrot= (-[A][u][G])'f

            ChStarMatrix33<> Xpos(vrelpoint);
            ChVector<> VQtemp = Xpos.transpose() * relforce; // = [u]'[A]'F,w

            ChGlMatrix34<> mGl(my_body->GetCoord().rot);
            ChVectorN<double, 4> Qfrot = -mGl.transpose() * VQtemp.eigen(); // Q = - [Gl]'[u]'[A]'F,w

            Qf.segment(3, 4) = Qfrot;

            break;
        }

        case TORQUE:
            Qf(0) = 0;  // pos.lagrangian Qfx
            Qf(1) = 0;
            Qf(2) = 0;

            // rot.lagangian
            ChGlMatrix34<> mGl(my_body->GetCoord().rot);
            ChVectorN<double, 4> Qfrot = mGl.transpose() * relforce.eigen();

            Qf.segment(3, 4) = Qfrot;

            break;
    }
}